

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alone_decoder.c
# Opt level: O0

lzma_ret lzma_alone_decoder_init
                   (lzma_next_coder *next,lzma_allocator *allocator,uint64_t memlimit,_Bool picky)

{
  _func_void_ptr_void_ptr_size_t_size_t *__dest;
  uint64_t local_90;
  undefined1 local_80 [8];
  undefined8 local_78;
  _func_void_ptr_void_ptr_size_t_size_t *local_38;
  lzma_alone_coder *coder;
  uint64_t uStack_28;
  _Bool picky_local;
  uint64_t memlimit_local;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  coder._7_1_ = picky;
  uStack_28 = memlimit;
  memlimit_local = (uint64_t)allocator;
  allocator_local = (lzma_allocator *)next;
  if ((code *)next->init != lzma_alone_decoder_init) {
    lzma_next_end(next,allocator);
  }
  allocator_local->opaque = lzma_alone_decoder_init;
  local_38 = allocator_local->alloc;
  if (local_38 == (_func_void_ptr_void_ptr_size_t_size_t *)0x0) {
    __dest = (_func_void_ptr_void_ptr_size_t_size_t *)
             lzma_alloc(0xe0,(lzma_allocator *)memlimit_local);
    if (__dest == (_func_void_ptr_void_ptr_size_t_size_t *)0x0) {
      return LZMA_MEM_ERROR;
    }
    allocator_local->alloc = __dest;
    allocator_local[1].alloc = alone_decode;
    allocator_local[1].free = alone_decoder_end;
    allocator_local[2].free = alone_decoder_memconfig;
    local_38 = __dest;
    memset(local_80,0,0x48);
    local_78 = 0xffffffffffffffff;
    memcpy(__dest,local_80,0x48);
  }
  *(undefined4 *)(local_38 + 0x48) = 0;
  local_38[0x4c] = (_func_void_ptr_void_ptr_size_t_size_t)(coder._7_1_ & 1);
  *(undefined8 *)(local_38 + 0x50) = 0;
  *(undefined4 *)(local_38 + 0x70) = 0;
  *(undefined8 *)(local_38 + 0x78) = 0;
  *(undefined4 *)(local_38 + 0x80) = 0;
  *(undefined8 *)(local_38 + 0x58) = 0;
  if (uStack_28 == 0) {
    local_90 = 1;
  }
  else {
    local_90 = uStack_28;
  }
  *(uint64_t *)(local_38 + 0x60) = local_90;
  *(undefined8 *)(local_38 + 0x68) = 0x8000;
  return LZMA_OK;
}

Assistant:

extern lzma_ret
lzma_alone_decoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		uint64_t memlimit, bool picky)
{
	lzma_next_coder_init(&lzma_alone_decoder_init, next, allocator);

	lzma_alone_coder *coder = next->coder;

	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_alone_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &alone_decode;
		next->end = &alone_decoder_end;
		next->memconfig = &alone_decoder_memconfig;
		coder->next = LZMA_NEXT_CODER_INIT;
	}

	coder->sequence = SEQ_PROPERTIES;
	coder->picky = picky;
	coder->pos = 0;
	coder->options.dict_size = 0;
	coder->options.preset_dict = NULL;
	coder->options.preset_dict_size = 0;
	coder->uncompressed_size = 0;
	coder->memlimit = my_max(1, memlimit);
	coder->memusage = LZMA_MEMUSAGE_BASE;

	return LZMA_OK;
}